

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fstream.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  char *pcVar7;
  long *plVar8;
  exception *e;
  string local_4840 [32];
  ostringstream local_4820 [8];
  ostringstream ss_34;
  string local_46a0 [32];
  ostringstream local_4680 [8];
  ostringstream ss_33;
  string local_4500 [32];
  ostringstream local_44e0 [8];
  ostringstream ss_32;
  string local_4360 [32];
  ostringstream local_4340 [8];
  ostringstream ss_31;
  string local_41c0 [32];
  ostringstream local_41a0 [8];
  ostringstream ss_30;
  fpos<__mbstate_t> local_4028;
  undefined1 local_4011;
  string local_4010 [32];
  ostringstream local_3ff0 [8];
  ostringstream ss_29;
  string local_3e70 [32];
  ostringstream local_3e50 [8];
  ostringstream ss_28;
  string local_3cd0 [32];
  ostringstream local_3cb0 [8];
  ostringstream ss_27;
  string local_3b30 [32];
  ostringstream local_3b10 [8];
  ostringstream ss_26;
  string local_3990 [32];
  ostringstream local_3970 [8];
  ostringstream ss_25;
  string local_37f0 [32];
  ostringstream local_37d0 [8];
  ostringstream ss_24;
  string local_3650 [32];
  ostringstream local_3630 [8];
  ostringstream ss_23;
  string local_34b0 [32];
  ostringstream local_3490 [8];
  ostringstream ss_22;
  string local_3310 [32];
  ostringstream local_32f0 [8];
  ostringstream ss_21;
  string local_3170 [32];
  ostringstream local_3150 [8];
  ostringstream ss_20;
  string local_2fd0 [32];
  ostringstream local_2fb0 [8];
  ostringstream ss_19;
  string local_2e30 [32];
  ostringstream local_2e10 [8];
  ostringstream ss_18;
  fpos<__mbstate_t> local_2c98;
  undefined1 local_2c81;
  string local_2c80 [32];
  ostringstream local_2c60 [8];
  ostringstream ss_17;
  fpos<__mbstate_t> local_2ae8;
  undefined1 local_2ad1;
  string local_2ad0 [32];
  ostringstream local_2ab0 [8];
  ostringstream ss_16;
  string local_2930 [32];
  ostringstream local_2910 [8];
  ostringstream ss_15;
  fpos<__mbstate_t> local_2798;
  undefined1 local_2781;
  string local_2780 [32];
  ostringstream local_2760 [8];
  ostringstream ss_14;
  string local_25e0 [32];
  ostringstream local_25c0 [8];
  ostringstream ss_13;
  fpos<__mbstate_t> local_2448;
  undefined1 local_2431;
  string local_2430 [32];
  ostringstream local_2410 [8];
  ostringstream ss_12;
  string local_2290 [32];
  ostringstream local_2270 [8];
  ostringstream ss_11;
  string local_20f0 [32];
  ostringstream local_20d0 [8];
  ostringstream ss_10;
  fpos<__mbstate_t> local_1f58;
  long local_1f48;
  fstream f_1;
  undefined1 local_1f38 [512];
  undefined1 local_1d38 [8];
  char buf [16];
  int i;
  ostringstream local_1d00 [8];
  ostringstream ss_9;
  fpos<__mbstate_t> local_1b88;
  string local_1b78 [8];
  string tmp_3;
  string local_1b50 [32];
  ostringstream local_1b30 [8];
  ostringstream ss_8;
  long local_19b8;
  fstream f;
  ostream local_19a8 [519];
  undefined1 local_17a1;
  string local_17a0 [32];
  ostringstream local_1780 [8];
  ostringstream ss_7;
  long local_1608;
  ifstream fi_3;
  string local_13f8 [32];
  ostringstream local_13d8 [8];
  ostringstream ss_6;
  string local_1260 [8];
  string tmp_2;
  string local_1238 [32];
  ostringstream local_1218 [8];
  ostringstream ss_5;
  long local_10a0;
  ifstream fi_2;
  string local_e90 [32];
  ostringstream local_e70 [8];
  ostringstream ss_4;
  string local_cf8 [8];
  string tmp_1;
  string local_cd0 [32];
  ostringstream local_cb0 [8];
  ostringstream ss_3;
  long local_b38;
  ifstream fi_1;
  string local_928 [32];
  ostringstream local_908 [8];
  ostringstream ss_2;
  string local_790 [8];
  string tmp;
  string local_768 [32];
  ostringstream local_748 [8];
  ostringstream ss_1;
  long local_5d0;
  ifstream fi;
  string local_3c0 [32];
  ostringstream local_3a0 [8];
  ostringstream ss;
  long local_228;
  ofstream fo;
  char *example;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing fstream");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ofstream::ofstream(&local_228);
  std::ofstream::open((char *)&local_228,0x107004);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3a0);
    poVar5 = std::operator<<((ostream *)local_3a0,"Error fo in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1d);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3c0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar5 = std::operator<<((ostream *)&local_228,"test");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ifstream::ifstream(&local_5d0);
  std::ifstream::open((char *)&local_5d0,0x107004);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_5d0 + *(long *)(local_5d0 + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_748);
    poVar5 = std::operator<<((ostream *)local_748,"Error fi in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_768);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_790);
  std::operator>>((istream *)&local_5d0,local_790);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_790,"test");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_908);
    poVar5 = std::operator<<((ostream *)local_908,"Error tmp==\"test\" in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_928);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_790);
  std::ifstream::~ifstream(&local_5d0);
  std::ifstream::ifstream(&local_b38,anon_var_dwarf_a1c,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_b38 + *(long *)(local_b38 + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_cb0);
    poVar5 = std::operator<<((ostream *)local_cb0,"Error fi in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x38);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_cd0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_cf8);
  std::operator>>((istream *)&local_b38,local_cf8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_cf8,"test");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_e70);
    poVar5 = std::operator<<((ostream *)local_e70,"Error tmp==\"test\" in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3b);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_e90);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_cf8);
  std::ifstream::~ifstream(&local_b38);
  std::ifstream::ifstream(&local_10a0,anon_var_dwarf_a1c,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&local_10a0 + *(long *)(local_10a0 + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1218);
    poVar5 = std::operator<<((ostream *)local_1218,"Error fi in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x40);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1238);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_1260);
  std::operator>>((istream *)&local_10a0,local_1260);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1260,"test");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_13d8);
    poVar5 = std::operator<<((ostream *)local_13d8,"Error tmp==\"test\" in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x43);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_13f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_1260);
  std::ifstream::~ifstream(&local_10a0);
  std::ifstream::ifstream(&local_1608);
  remove(anon_var_dwarf_a1c);
  std::ifstream::open((char *)&local_1608,0x107004);
  bVar2 = std::ios::operator!((ios *)((long)&local_1608 + *(long *)(local_1608 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1780);
    poVar5 = std::operator<<((ostream *)local_1780,"Error !fi in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4b);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    local_17a1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_17a0);
    local_17a1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::~ifstream(&local_1608);
  _Var3 = std::operator|(_S_in,_S_out);
  _Var3 = std::operator|(_Var3,_S_trunc);
  _Var3 = std::operator|(_Var3,_S_bin);
  std::fstream::fstream(&local_19b8,anon_var_dwarf_a1c,_Var3);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&local_19b8 + *(long *)(local_19b8 + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b30);
    poVar5 = std::operator<<((ostream *)local_1b30,"Error f in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1b50);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<(local_19a8,"test2");
  std::__cxx11::string::string(local_1b78);
  std::fpos<__mbstate_t>::fpos(&local_1b88,0);
  std::istream::seekg(&local_19b8,local_1b88._M_off,local_1b88._M_state);
  std::operator>>((istream *)&local_19b8,local_1b78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b78,"test2");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1d00);
    poVar5 = std::operator<<((ostream *)local_1d00,"Error tmp==\"test2\" in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x54);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    buf[0xf] = '\x01';
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,(string *)&i);
    buf[0xf] = '\0';
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::fstream::close();
  std::__cxx11::string::~string(local_1b78);
  std::fstream::~fstream(&local_19b8);
  remove(anon_var_dwarf_a1c);
  std::ofstream::~ofstream(&local_228);
  buf[8] = -1;
  buf[9] = -1;
  buf[10] = -1;
  buf[0xb] = -1;
  while( true ) {
    if (0xf < (int)buf._8_4_) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Complex io with buffer = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,buf._8_4_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::fstream::fstream(&local_1f48);
    if (buf._8_4_ == 0) {
      pcVar7 = (char *)std::fstream::rdbuf();
      std::streambuf::pubsetbuf(pcVar7,0);
    }
    else if (0 < (int)buf._8_4_) {
      pcVar7 = (char *)std::fstream::rdbuf();
      std::streambuf::pubsetbuf(pcVar7,(long)local_1d38);
    }
    _Var3 = std::operator|(_S_in,_S_out);
    _Var3 = std::operator|(_Var3,_S_trunc);
    std::operator|(_Var3,_S_bin);
    std::fstream::open((char *)&local_1f48,0x107004);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::ostream::put((char)local_1f38);
    std::fpos<__mbstate_t>::fpos(&local_1f58,0);
    std::istream::seekg(&local_1f48,local_1f58._M_off,local_1f58._M_state);
    iVar4 = std::istream::get();
    if (iVar4 != 0x61) {
      std::__cxx11::ostringstream::ostringstream(local_20d0);
      poVar5 = std::operator<<((ostream *)local_20d0,"Error f.get()==\'a\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6c);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_20f0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)&local_1f48,_S_cur);
    iVar4 = std::istream::get();
    if (iVar4 != 99) {
      std::__cxx11::ostringstream::ostringstream(local_2270);
      poVar5 = std::operator<<((ostream *)local_2270,"Error f.get()==\'c\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6e);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2290);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)&local_1f48,~_S_beg);
    iVar4 = std::istream::get();
    if (iVar4 != 99) {
      std::__cxx11::ostringstream::ostringstream(local_2410);
      poVar5 = std::operator<<((ostream *)local_2410,"Error f.get()==\'c\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x70);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_2431 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2430);
      local_2431 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fpos<__mbstate_t>::fpos(&local_2448,1);
    plVar8 = (long *)std::istream::seekg(&local_1f48,local_2448._M_off,local_2448._M_state);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_25c0);
      poVar5 = std::operator<<((ostream *)local_25c0,"Error f.seekg(1) in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x71);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_25e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ostream::put((char)local_1f38);
    iVar4 = std::istream::get();
    if (iVar4 != 99) {
      std::__cxx11::ostringstream::ostringstream(local_2760);
      poVar5 = std::operator<<((ostream *)local_2760,"Error f.get()==\'c\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x73);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_2781 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2780);
      local_2781 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fpos<__mbstate_t>::fpos(&local_2798,1);
    plVar8 = (long *)std::istream::seekg(&local_1f48,local_2798._M_off,local_2798._M_state);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2910);
      poVar5 = std::operator<<((ostream *)local_2910,"Error f.seekg(1) in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x74);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2930);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x42) {
      std::__cxx11::ostringstream::ostringstream(local_2ab0);
      poVar5 = std::operator<<((ostream *)local_2ab0,"Error f.get() == \'B\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x75);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_2ad1 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2ad0);
      local_2ad1 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fpos<__mbstate_t>::fpos(&local_2ae8,2);
    std::istream::seekg(&local_1f48,local_2ae8._M_off,local_2ae8._M_state);
    std::ostream::put((char)local_1f38);
    iVar4 = std::istream::get();
    if (iVar4 != 100) {
      std::__cxx11::ostringstream::ostringstream(local_2c60);
      poVar5 = std::operator<<((ostream *)local_2c60,"Error f.get()==\'d\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x78);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_2c81 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2c80);
      local_2c81 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fpos<__mbstate_t>::fpos(&local_2c98,0);
    std::istream::seekg(&local_1f48,local_2c98._M_off,local_2c98._M_state);
    iVar4 = std::istream::get();
    if (iVar4 != 0x61) {
      std::__cxx11::ostringstream::ostringstream(local_2e10);
      poVar5 = std::operator<<((ostream *)local_2e10,"Error f.get()==\'a\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2e30);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x42) {
      std::__cxx11::ostringstream::ostringstream(local_2fb0);
      poVar5 = std::operator<<((ostream *)local_2fb0,"Error f.get()==\'B\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_2fd0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x43) {
      std::__cxx11::ostringstream::ostringstream(local_3150);
      poVar5 = std::operator<<((ostream *)local_3150,"Error f.get()==\'C\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7c);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3170);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 100) {
      std::__cxx11::ostringstream::ostringstream(local_32f0);
      poVar5 = std::operator<<((ostream *)local_32f0,"Error f.get()==\'d\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7d);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3310);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x65) {
      std::__cxx11::ostringstream::ostringstream(local_3490);
      poVar5 = std::operator<<((ostream *)local_3490,"Error f.get()==\'e\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7e);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_34b0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar8 = (long *)std::istream::putback((char)&local_1f48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3630);
      poVar5 = std::operator<<((ostream *)local_3630,"Error f.putback(\'e\') in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7f);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3650);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar8 = (long *)std::istream::putback((char)&local_1f48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) break;
    iVar4 = std::istream::get();
    if (iVar4 != 100) {
      std::__cxx11::ostringstream::ostringstream(local_3970);
      poVar5 = std::operator<<((ostream *)local_3970,"Error f.get()==\'d\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x81);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3990);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x65) {
      std::__cxx11::ostringstream::ostringstream(local_3b10);
      poVar5 = std::operator<<((ostream *)local_3b10,"Error f.get()==\'e\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x82);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3b30);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x66) {
      std::__cxx11::ostringstream::ostringstream(local_3cb0);
      poVar5 = std::operator<<((ostream *)local_3cb0,"Error f.get()==\'f\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3cd0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x67) {
      std::__cxx11::ostringstream::ostringstream(local_3e50);
      poVar5 = std::operator<<((ostream *)local_3e50,"Error f.get()==\'g\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x84);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3e70);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::istream::get();
    if (iVar4 != -1) {
      std::__cxx11::ostringstream::ostringstream(local_3ff0);
      poVar5 = std::operator<<((ostream *)local_3ff0,"Error f.get()==EOF in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x85);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_4011 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_4010);
      local_4011 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ios::clear((long)&local_1f48 + *(long *)(local_1f48 + -0x18),0);
    std::fpos<__mbstate_t>::fpos(&local_4028,1);
    std::istream::seekg(&local_1f48,local_4028._M_off,local_4028._M_state);
    iVar4 = std::istream::get();
    if (iVar4 != 0x42) {
      std::__cxx11::ostringstream::ostringstream(local_41a0);
      poVar5 = std::operator<<((ostream *)local_41a0,"Error f.get()==\'B\' in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x88);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_41c0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar8 = (long *)std::istream::putback((char)&local_1f48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4340);
      poVar5 = std::operator<<((ostream *)local_4340,"Error f.putback(\'B\') in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x89);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_4360);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar8 = (long *)std::istream::putback((char)&local_1f48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_44e0);
      poVar5 = std::operator<<((ostream *)local_44e0,"Error f.putback(\'a\') in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8a);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_4500);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar8 = (long *)std::istream::putback((char)&local_1f48);
    bVar2 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_4680);
      poVar5 = std::operator<<((ostream *)local_4680,"Error !f.putback(\'x\') in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_46a0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    iVar4 = remove(anon_var_dwarf_a1c);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_4820);
      poVar5 = std::operator<<((ostream *)local_4820,"Error nowide::remove(example)==0 in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_4840);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::~fstream(&local_1f48);
    buf._8_4_ = buf._8_4_ + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_37d0);
  poVar5 = std::operator<<((ostream *)local_37d0,"Error f.putback(\'d\') in ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                          );
  poVar5 = std::operator<<(poVar5,':');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x80);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"main");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_37f0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    
    char const *example = "\xd7\xa9-\xd0\xbc-\xce\xbd" ".txt";
#ifdef NOWIDE_WINDOWS
    wchar_t const *wexample = L"\u05e9-\u043c-\u03bd.txt";
#endif    

    try {
        namespace nw=nowide;
        
        std::cout << "Testing fstream" << std::endl;
        {
            nw::ofstream fo;
            fo.open(example);
            TEST(fo);
            fo<<"test"<<std::endl;
            fo.close();
            #ifdef NOWIDE_WINDOWS
            {
                FILE *tmp=_wfopen(wexample,L"r");
                TEST(tmp);
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='e');
                TEST(fgetc(tmp)=='s');
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='\n');
                TEST(fgetc(tmp)==EOF);
                fclose(tmp);
            }
            #endif
            {
                nw::ifstream fi;
                fi.open(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example,std::ios::binary);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }

            {
                nw::ifstream fi;
                nw::remove(example);
                fi.open(example);
                TEST(!fi);
            }
            {
                nw::fstream f(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
                TEST(f);
                f << "test2" ;
                std::string tmp;
                f.seekg(0);
                f>> tmp;
                TEST(tmp=="test2");
                f.close();
            }
            nw::remove(example);
        }
        
        for(int i=-1;i<16;i++) {
            std::cout << "Complex io with buffer = " << i << std::endl;
            char buf[16];
            nw::fstream f;
            if(i==0)
                f.rdbuf()->pubsetbuf(0,0);
            else if (i > 0) 
                f.rdbuf()->pubsetbuf(buf,i);
            
            f.open(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
            f.put('a');
            f.put('b');
            f.put('c');
            f.put('d');
            f.put('e');
            f.put('f');
            f.put('g');
            f.seekg(0);
            TEST(f.get()=='a');
            f.seekg(1,std::ios::cur);
            TEST(f.get()=='c');
            f.seekg(-1,std::ios::cur);
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            f.put('B');
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            TEST(f.get() == 'B');
            f.seekg(2);
            f.put('C');
            TEST(f.get()=='d');
            f.seekg(0);
            TEST(f.get()=='a');
            TEST(f.get()=='B');
            TEST(f.get()=='C');
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.putback('e'));
            TEST(f.putback('d'));
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.get()=='f');
            TEST(f.get()=='g');
            TEST(f.get()==EOF);
            f.clear();
            f.seekg(1);
            TEST(f.get()=='B');
            TEST(f.putback('B'));
            TEST(f.putback('a'));
            TEST(!f.putback('x'));
            f.close();
            TEST(nowide::remove(example)==0);
            
        }
            
    }
    catch(std::exception const &e) {
        std::cerr << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;

}